

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

void __thiscall r_exec::Group::_set_0_positive(Group *this,uint16_t member_index,float value)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Atom local_30 [20];
  Atom local_1c [4];
  float local_18;
  ushort local_12;
  float value_local;
  uint16_t member_index_local;
  Group *this_local;
  
  local_18 = value;
  local_12 = member_index;
  _value_local = this;
  if (0.0 <= value) {
    r_code::Atom::Float(value);
    iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[4])(this,(ulong)local_12);
    r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_00,iVar1),local_30);
    r_code::Atom::~Atom(local_30);
  }
  else {
    r_code::Atom::Float(0.0);
    iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[4])(this,(ulong)local_12);
    r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar1),local_1c);
    r_code::Atom::~Atom(local_1c);
  }
  return;
}

Assistant:

void Group::_set_0_positive(uint16_t member_index, float value)
{
    if (value < 0) {
        code(member_index) = Atom::Float(0);
    } else {
        code(member_index) = Atom::Float(value);
    }
}